

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

NotEqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_notequal(NeuralNetworkLayer *this)

{
  bool bVar1;
  NotEqualLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_notequal(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_notequal(this);
    this_00 = (NotEqualLayerParams *)operator_new(0x18);
    NotEqualLayerParams::NotEqualLayerParams(this_00);
    (this->layer_).notequal_ = this_00;
  }
  return (NotEqualLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::NotEqualLayerParams* NeuralNetworkLayer::mutable_notequal() {
  if (!has_notequal()) {
    clear_layer();
    set_has_notequal();
    layer_.notequal_ = new ::CoreML::Specification::NotEqualLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.notEqual)
  return layer_.notequal_;
}